

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1f29eed::VectorVarTest_DISABLED_Speed_Test::TestBody
          (VectorVarTest_DISABLED_Speed_Test *this)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  SEARCH_METHODS *pSVar5;
  long lVar6;
  int sum_simd_var;
  int simd_var;
  int c_var;
  int sum_c_var;
  AssertionResult gtest_ar;
  aom_usec_timer c_timer_;
  aom_usec_timer simd_timer_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  AssertHelper local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  internal local_60 [8];
  undefined8 *local_58;
  timeval local_50;
  timeval local_40;
  timeval local_30;
  timeval local_20;
  
  VectorVarTestBase::FillRandom((VectorVarTestBase *)this);
  printf("Width = %d number of iteration is %d \n",
         (ulong)(uint)(this->super_VectorVarTest).super_VectorVarTestBase.width,5000000);
  local_64 = 0;
  local_68 = 0;
  gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  lVar6 = 5000000;
  do {
    local_68 = (*(this->super_VectorVarTest).c_func)
                         ((this->super_VectorVarTest).super_VectorVarTestBase.ref_vector,
                          (this->super_VectorVarTest).super_VectorVarTestBase.src_vector,
                          (this->super_VectorVarTest).super_VectorVarTestBase.m_bwl);
    local_64 = local_64 + local_68;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  local_6c = 0;
  local_70 = 0;
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  lVar6 = 5000000;
  do {
    local_6c = (*(this->super_VectorVarTest).simd_func)
                         ((this->super_VectorVarTest).super_VectorVarTestBase.ref_vector,
                          (this->super_VectorVarTest).super_VectorVarTestBase.src_vector,
                          (this->super_VectorVarTest).super_VectorVarTestBase.m_bwl);
    local_70 = local_70 + local_6c;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  lVar6 = local_40.tv_usec - local_50.tv_usec;
  iVar4 = (int)lVar6 + 1000000;
  if (-1 < lVar6) {
    iVar4 = (int)lVar6;
  }
  lVar2 = local_20.tv_usec - local_30.tv_usec;
  iVar3 = (int)lVar2 + 1000000;
  if (-1 < lVar2) {
    iVar3 = (int)lVar2;
  }
  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n",
         (double)((float)(iVar4 + ((int)(lVar6 >> 0x3f) +
                                  ((int)local_40.tv_sec - (int)local_50.tv_sec)) * 1000000) /
                 (float)(iVar3 + ((int)(lVar2 >> 0x3f) +
                                 ((int)local_20.tv_sec - (int)local_30.tv_sec)) * 1000000)));
  testing::internal::CmpHelperEQ<int,int>(local_60,"c_var","simd_var",&local_68,&local_6c);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_80._M_head_impl + 0x10),"Output mismatch \n",0x11);
    if (local_58 == (undefined8 *)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = (SEARCH_METHODS *)*local_58;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x2d9,(char *)pSVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  puVar1 = local_58;
  if (local_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_58 != local_58 + 2) {
      operator_delete((undefined8 *)*local_58);
    }
    operator_delete(puVar1);
  }
  testing::internal::CmpHelperEQ<int,int>(local_60,"sum_c_var","sum_simd_var",&local_64,&local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_80._M_head_impl + 0x10),"Output mismatch \n",0x11);
    if (local_58 == (undefined8 *)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = (SEARCH_METHODS *)*local_58;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x2da,(char *)pSVar5);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_58 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_58 != local_58 + 2) {
      operator_delete((undefined8 *)*local_58);
    }
    operator_delete(local_58);
  }
  return;
}

Assistant:

TEST_P(VectorVarTest, DISABLED_Speed) {
  FillRandom();
  const int numIter = 5000000;
  printf("Width = %d number of iteration is %d \n", width, numIter);

  int sum_c_var = 0;
  int c_var = 0;

  aom_usec_timer c_timer_;
  aom_usec_timer_start(&c_timer_);
  for (size_t i = 0; i < numIter; i++) {
    c_var = calcVarC();
    sum_c_var += c_var;
  }
  aom_usec_timer_mark(&c_timer_);

  int simd_var = 0;
  int sum_simd_var = 0;
  aom_usec_timer simd_timer_;
  aom_usec_timer_start(&simd_timer_);
  for (size_t i = 0; i < numIter; i++) {
    simd_var = calcVarSIMD();
    sum_simd_var += simd_var;
  }
  aom_usec_timer_mark(&simd_timer_);

  const int c_sum_time = static_cast<int>(aom_usec_timer_elapsed(&c_timer_));
  const int simd_sum_time =
      static_cast<int>(aom_usec_timer_elapsed(&simd_timer_));

  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n", c_sum_time,
         simd_sum_time,
         (static_cast<float>(c_sum_time) / static_cast<float>(simd_sum_time)));

  EXPECT_EQ(c_var, simd_var) << "Output mismatch \n";
  EXPECT_EQ(sum_c_var, sum_simd_var) << "Output mismatch \n";
}